

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_highbd_inv_txfm_add_4x16_sse4_1
               (tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  int eob;
  TX_SIZE tx_size;
  TX_TYPE tx_type;
  int bd;
  int in_stack_000002c4;
  TX_SIZE in_stack_000002ca;
  TX_TYPE in_stack_000002cb;
  int in_stack_000002cc;
  uint16_t *in_stack_000002d0;
  int32_t *in_stack_000002d8;
  int in_stack_000004f0;
  
  highbd_inv_txfm2d_add_4x16_sse4_1
            (in_stack_000002d8,in_stack_000002d0,in_stack_000002cc,in_stack_000002cb,
             in_stack_000002ca,in_stack_000002c4,in_stack_000004f0);
  return;
}

Assistant:

static void av1_highbd_inv_txfm_add_4x16_sse4_1(const tran_low_t *input,
                                                uint8_t *dest, int stride,
                                                const TxfmParam *txfm_param) {
  int bd = txfm_param->bd;
  const TX_TYPE tx_type = txfm_param->tx_type;
  const TX_SIZE tx_size = txfm_param->tx_size;
  int eob = txfm_param->eob;
  highbd_inv_txfm2d_add_4x16_sse4_1(input, CONVERT_TO_SHORTPTR(dest), stride,
                                    tx_type, tx_size, eob, bd);
}